

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,Token *args)

{
  ulong uVar1;
  pointer p;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  long lVar10;
  pointer __src;
  size_type sVar11;
  ulong uVar12;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar3 = args->field_0x2;
    NVar4.raw = (args->numFlags).raw;
    uVar5 = args->rawLen;
    pIVar2 = args->info;
    __src->kind = args->kind;
    __src->field_0x2 = uVar3;
    __src->numFlags = (NumericTokenFlags)NVar4.raw;
    __src->rawLen = uVar5;
    __src->info = pIVar2;
    sVar11 = this->len;
    this->len = sVar11 + 1;
    return this->data_ + sVar11;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar1 = this->cap;
  if (uVar12 < uVar1 * 2) {
    uVar12 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar10 = (long)__src - (long)this->data_;
  pTVar6 = (pointer)operator_new(uVar12 << 4);
  pIVar2 = args->info;
  *(undefined8 *)((long)pTVar6 + lVar10) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar6 + lVar10))[1] = pIVar2;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x10 - (long)__src);
  pTVar7 = p;
  pTVar8 = pTVar6;
  if (lVar9 == 0) {
    pTVar7 = pTVar6;
    pTVar8 = p;
    if (sVar11 != 0) {
      do {
        uVar3 = pTVar8->field_0x2;
        NVar4.raw = (pTVar8->numFlags).raw;
        uVar5 = pTVar8->rawLen;
        pIVar2 = pTVar8->info;
        pTVar7->kind = pTVar8->kind;
        pTVar7->field_0x2 = uVar3;
        pTVar7->numFlags = (NumericTokenFlags)NVar4.raw;
        pTVar7->rawLen = uVar5;
        pTVar7->info = pIVar2;
        pTVar8 = pTVar8 + 1;
        pTVar7 = pTVar7 + 1;
      } while (pTVar8 != __src);
    }
  }
  else {
    for (; pTVar7 != __src; pTVar7 = pTVar7 + 1) {
      uVar3 = pTVar7->field_0x2;
      NVar4.raw = (pTVar7->numFlags).raw;
      uVar5 = pTVar7->rawLen;
      pIVar2 = pTVar7->info;
      pTVar8->kind = pTVar7->kind;
      pTVar8->field_0x2 = uVar3;
      pTVar8->numFlags = (NumericTokenFlags)NVar4.raw;
      pTVar8->rawLen = uVar5;
      pTVar8->info = pIVar2;
      pTVar8 = pTVar8 + 1;
    }
    memcpy((void *)((long)pTVar6 + lVar10 + 0x10),__src,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pTVar6;
  return (reference)((long)pTVar6 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }